

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console.cpp
# Opt level: O3

bool __thiscall
CNetConsole::Open(CNetConsole *this,NETADDR_conflict BindAddr,CNetBan *pNetBan,
                 NETFUNC_NEWCLIENT pfnNewClient,NETFUNC_DELCLIENT pfnDelClient,void *pUser)

{
  int iVar1;
  long lVar2;
  NETSOCKET sock;
  undefined1 in_stack_00000020 [24];
  
  mem_zero(this,0x2600);
  (this->m_Socket).type = 0;
  (this->m_Socket).ipv4sock = -1;
  (this->m_Socket).ipv6sock = -1;
  this->m_pNetBan = pNetBan;
  sock = net_tcp_create((NETADDR)in_stack_00000020);
  this->m_Socket = sock;
  if ((sock.type != 0) && (iVar1 = net_tcp_listen(sock,4), iVar1 == 0)) {
    net_set_non_blocking(this->m_Socket);
    lVar2 = 0x18;
    do {
      CConsoleNetConnection::Reset
                ((CConsoleNetConnection *)
                 (this->m_aSlots[0].m_Connection.m_PeerAddr.ip + lVar2 + -0x20));
      lVar2 = lVar2 + 0x6a8;
    } while (lVar2 != 0x1ab8);
    this->m_pfnNewClient = pfnNewClient;
    this->m_pfnDelClient = pfnDelClient;
    this->m_UserPtr = pUser;
    return true;
  }
  return false;
}

Assistant:

bool CNetConsole::Open(NETADDR BindAddr, CNetBan *pNetBan, NETFUNC_NEWCLIENT pfnNewClient, NETFUNC_DELCLIENT pfnDelClient, void *pUser)
{
	// zero out the whole structure
	mem_zero(this, sizeof(*this));
	m_Socket.type = NETTYPE_INVALID;
	m_Socket.ipv4sock = -1;
	m_Socket.ipv6sock = -1;
	m_pNetBan = pNetBan;

	// open socket
	m_Socket = net_tcp_create(BindAddr);
	if(!m_Socket.type)
		return false;
	if(net_tcp_listen(m_Socket, NET_MAX_CONSOLE_CLIENTS))
		return false;
	net_set_non_blocking(m_Socket);

	for(int i = 0; i < NET_MAX_CONSOLE_CLIENTS; i++)
		m_aSlots[i].m_Connection.Reset();

	m_pfnNewClient = pfnNewClient;
	m_pfnDelClient = pfnDelClient;
	m_UserPtr = pUser;

	return true;
}